

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Application.cpp
# Opt level: O3

void __thiscall
arealights::Application::preloadShaderInclude
          (Application *this,char *filepath,string *glslIncludePath)

{
  GLenum msg;
  Writer *pWVar1;
  string cookTorranceShader;
  allocator<char> local_c1;
  string local_c0;
  undefined1 local_a0 [32];
  char *local_80;
  VerboseLevel local_78;
  Logger *local_70;
  bool local_68;
  Logger *local_60;
  char *local_58;
  DispatchAction local_50;
  pointer local_48;
  pointer pbStack_40;
  pointer local_38;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)local_a0,filepath,&local_c1);
  fw::loadASCIITextFile(&local_c0,(string *)local_a0);
  if ((undefined1 *)local_a0._0_8_ != local_a0 + 0x10) {
    operator_delete((void *)local_a0._0_8_,(ulong)(local_a0._16_8_ + 1));
  }
  (*glad_glNamedStringARB)
            (0x8dae,(GLint)glslIncludePath->_M_string_length,(glslIncludePath->_M_dataplus)._M_p,
             (GLint)local_c0._M_string_length,local_c0._M_dataplus._M_p);
  while( true ) {
    msg = (*glad_glGetError)();
    if (msg == 0) break;
    local_a0._0_8_ = &PTR__Writer_001f54f0;
    local_a0._8_4_ = Error;
    local_a0._16_8_ =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/sienkiewiczkm[P]arealights/source/Application.cpp"
    ;
    local_a0._24_8_ = 0xd0;
    local_80 = "void arealights::Application::preloadShaderInclude(const char *, std::string) const"
    ;
    local_78 = 0;
    local_70 = (Logger *)0x0;
    local_68 = false;
    local_60 = (Logger *)0x0;
    local_58 = "";
    local_50 = NormalLog;
    local_38 = (pointer)0x0;
    local_48 = (pointer)0x0;
    pbStack_40 = (pointer)0x0;
    pWVar1 = el::base::Writer::construct((Writer *)local_a0,1,"framework");
    if (pWVar1->m_proceed == true) {
      el::base::MessageBuilder::operator<<(&pWVar1->m_messageBuilder,msg);
    }
    el::base::Writer::~Writer((Writer *)local_a0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
    operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void Application::preloadShaderInclude(const char *filepath, std::string glslIncludePath) const
{
    auto cookTorranceShader = fw::loadASCIITextFile(filepath);

    glNamedStringARB(
        GL_SHADER_INCLUDE_ARB,
        glslIncludePath.size(),
        glslIncludePath.c_str(),
        cookTorranceShader.size(),
        cookTorranceShader.c_str()
    );

    GLenum err;
    while((err = glGetError()) != GL_NO_ERROR)
    {
        LOG(ERROR) << err;
    }
}